

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

float PredictSingle(void *hPtr,char *input,char **predicted)

{
  ulong uVar1;
  pointer ppVar2;
  bool bVar3;
  char *pcVar4;
  allocator<char> local_1dd;
  float local_1dc;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  string local_1c0 [32];
  istringstream inStream;
  
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  predictions.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,input,&local_1dd);
  std::__cxx11::istringstream::istringstream((istringstream *)&inStream,local_1c0,_S_in);
  std::__cxx11::string::~string(local_1c0);
  local_1dc = 0.0;
  bVar3 = fasttext::FastText::predictLine((FastText *)hPtr,(istream *)&inStream,&predictions,1,0.0);
  ppVar2 = predictions.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar3) &&
     (predictions.
      super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      predictions.
      super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    uVar1 = ((predictions.
              super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length;
    pcVar4 = (char *)operator_new__(uVar1 + 1);
    std::__cxx11::string::copy((char *)&ppVar2->second,(ulong)pcVar4,uVar1);
    pcVar4[uVar1] = '\0';
    *predicted = pcVar4;
    local_1dc = (predictions.
                 super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&inStream);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&predictions);
  return local_1dc;
}

Assistant:

PredictSingle(void* hPtr, const char* input, char** predicted)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    std::vector<std::pair<real,std::string>> predictions;
    std::istringstream inStream(input);

    try {
        if (!fastText->predictLine(inStream, predictions, 1, 0)) {
            return 0;
        }

        if (predictions.empty()) {
            return 0;
        }
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto len = predictions[0].second.length();
    auto buff = new char[len + 1];
    predictions[0].second.copy(buff, len);
    buff[len] = '\0';

    *predicted = buff;

    return predictions[0].first;
}